

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_fourcc_equal(ma_uint8 *a,char *b)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((uint)*a == (int)*b) && ((uint)a[1] == (int)b[1])) && ((uint)a[2] == (int)b[2])) {
    uVar1 = (uint)((uint)a[3] == (int)b[3]);
  }
  return uVar1;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_fourcc_equal(const ma_uint8* a, const char* b)
{
    return
        a[0] == b[0] &&
        a[1] == b[1] &&
        a[2] == b[2] &&
        a[3] == b[3];
}